

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

int AF_A_Lower(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  BYTE BVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  player_t *this;
  PClass *pPVar5;
  undefined8 uVar6;
  PClass *pPVar7;
  DPSprite *this_00;
  DPSprite *this_01;
  FState *newstate;
  undefined4 in_register_00000014;
  VMValue *pVVar8;
  char *__assertion;
  bool bVar9;
  undefined1 auVar10 [16];
  FName local_2c;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  uVar6 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0052ecf8;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    puVar3 = (undefined8 *)(param->field_0).field_1.a;
    pVVar8 = param;
    if (puVar3 != (undefined8 *)0x0) {
      if (puVar3[1] == 0) {
        auVar10 = (**(code **)*puVar3)(puVar3);
        uVar6 = auVar10._8_8_;
        puVar3[1] = auVar10._0_8_;
      }
      pPVar7 = (PClass *)puVar3[1];
      bVar9 = pPVar7 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar9;
      uVar6 = CONCAT71((int7)((ulong)uVar6 >> 8),bVar9);
      pVVar8 = (VMValue *)(ulong)(pPVar7 == pPVar5 || bVar9);
      if (pPVar7 != pPVar5 && !bVar9) {
        do {
          pPVar7 = pPVar7->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
          if (pPVar7 == pPVar5) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0052ecf8;
      }
    }
    pPVar5 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_0052eccd;
      puVar4 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar4 != (undefined8 *)0x0) {
        if (puVar4[1] == 0) {
          uVar6 = (**(code **)*puVar4)(puVar4,pVVar8,uVar6,ret);
          puVar4[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar4[1];
        bVar9 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar5 && bVar9) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar9 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar5) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0052ecf8;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      this = (player_t *)puVar3[0x40];
      if (this == (player_t *)0x0) {
        return 0;
      }
      if (this->ReadyWeapon != (AWeapon *)0x0) {
        this_00 = player_t::GetPSprite(this,PSP_WEAPON);
        if ((this->morphTics == 0) && ((this->cheats & 0x800) == 0)) {
          this_00->y = this_00->y + 6.0;
        }
        else {
          this_00->y = 128.0;
        }
        if (this_00->y <= 128.0 && this_00->y != 128.0) {
          return 0;
        }
        BVar2 = this->playerstate;
        this_01 = player_t::GetPSprite(this,PSP_FLASH);
        DPSprite::SetState(this_01,(FState *)0x0,false);
        if (BVar2 == '\x01') {
          local_2c.Index = 0x9d;
          newstate = AActor::FindState((AActor *)this->ReadyWeapon,&local_2c);
          DPSprite::SetState(this_00,newstate,false);
          return 0;
        }
      }
      P_BringUpWeapon(this);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_0052eccd:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0052ecf8:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x422,"int AF_A_Lower(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AInventory, A_Lower)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player = self->player;
	DPSprite *psp;

	if (nullptr == player)
	{
		return 0;
	}
	if (nullptr == player->ReadyWeapon)
	{
		P_BringUpWeapon(player);
		return 0;
	}
	psp = player->GetPSprite(PSP_WEAPON);
	if (player->morphTics || player->cheats & CF_INSTANTWEAPSWITCH)
	{
		psp->y = WEAPONBOTTOM;
	}
	else
	{
		psp->y += LOWERSPEED;
	}
	if (psp->y < WEAPONBOTTOM)
	{ // Not lowered all the way yet
		return 0;
	}
	if (player->playerstate == PST_DEAD)
	{ // Player is dead, so don't bring up a pending weapon
		// Player is dead, so keep the weapon off screen
		P_SetPsprite(player, PSP_FLASH, nullptr);
		psp->SetState(player->ReadyWeapon->FindState(NAME_DeadLowered));
		return 0;
	}
	// [RH] Clear the flash state. Only needed for Strife.
	P_SetPsprite(player, PSP_FLASH, nullptr);
	P_BringUpWeapon (player);
	return 0;
}